

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_srcs.cxx
# Opt level: O0

void __thiscall xray_re::xr_sound_src_object::save_v12(xr_sound_src_object *this,xr_ini_writer *w)

{
  xr_ini_writer *this_00;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  string local_50 [32];
  anon_union_8_3_f28016de_for__vector2<float>_1 local_30;
  anon_union_8_3_f28016de_for__vector2<float>_1 local_28;
  anon_union_8_3_f28016de_for__vector2<float>_1 local_20;
  xr_ini_writer *local_18;
  xr_ini_writer *w_local;
  xr_sound_src_object *this_local;
  
  local_18 = w;
  w_local = (xr_ini_writer *)this;
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  local_20 = (this->m_active_time).field_0;
  xr_ini_writer::write(local_18,0x2e3883,__buf,in_RCX);
  xr_ini_writer::write
            (local_18,0x2e40af,(void *)(ulong)*(uint *)&(this->super_xr_custom_object).field_0x6c,
             in_RCX);
  xr_ini_writer::write(local_18,0x2e388f,__buf_00,in_RCX);
  xr_ini_writer::write(local_18,0x2e3894,__buf_01,in_RCX);
  xr_ini_writer::write(local_18,0x2e38a0,__buf_02,in_RCX);
  xr_ini_writer::write(local_18,0x2e38a9,__buf_03,in_RCX);
  local_28 = (this->m_play_time).field_0;
  xr_ini_writer::write(local_18,0x2e38b2,__buf_04,in_RCX);
  local_30 = (this->m_pause_time).field_0;
  xr_ini_writer::write(local_18,0x2e38bc,__buf_05,in_RCX);
  this_00 = local_18;
  std::__cxx11::string::string(local_50,(string *)&this->m_source_name);
  xr_ini_writer::write(this_00,0x2e38c9,local_50,0);
  std::__cxx11::string::~string(local_50);
  __n = (size_t)(uint)(this->m_sound_pos).field_0.field_0.z;
  xr_ini_writer::write(local_18,0x2e38d2,__buf_06,__n);
  xr_ini_writer::write(local_18,0x2e38df,(void *)(ulong)this->m_type,__n);
  xr_ini_writer::write(local_18,0x2e4e39,(void *)0x14,__n);
  xr_ini_writer::write(local_18,0x2e38e8,__buf_07,__n);
  return;
}

Assistant:

void xr_sound_src_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("active_time", m_active_time);
	w->write("flags", m_flags);
	w->write("freq", m_frequency);
	w->write("max_ai_dist", m_max_ai_dist);
	w->write("max_dist", m_max_dist);
	w->write("min_dist", m_min_dist);
	w->write("play_time", m_play_time);
	w->write("random_pause", m_pause_time);
	w->write("snd_name", m_source_name, false);
	w->write("snd_position", m_sound_pos);
	w->write("snd_type", m_type);

	w->write("version", SOUNDSRC_VERSION);
	w->write("volume", m_volume);
}